

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void SimpleHFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  __m128i *q1_00;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  __m128i *unaff_retaddr;
  __m128i *in_stack_00000008;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i *in_stack_00000070;
  int in_stack_00000120;
  __m128i *in_stack_ffffffffffffffb0;
  __m128i *in_stack_ffffffffffffffb8;
  __m128i *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  uint8_t *in_stack_ffffffffffffffd0;
  uint8_t *in_stack_ffffffffffffffd8;
  uint8_t *in_stack_ffffffffffffffe0;
  uint8_t *in_stack_ffffffffffffffe8;
  
  q1_00 = (__m128i *)(in_RDI + -2);
  Load16x4_SSE2(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                in_stack_00000070);
  DoFilter2_SSE2((__m128i *)q1[0],in_stack_00000008,unaff_retaddr,q1_00,in_ESI);
  Store16x4_SSE2(in_stack_00000008,unaff_retaddr,q1_00,(__m128i *)CONCAT44(in_ESI,in_EDX),
                 in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_00000120);
  return;
}

Assistant:

static void SimpleHFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  __m128i p1, p0, q0, q1;

  p -= 2;  // beginning of p1

  Load16x4_SSE2(p, p + 8 * stride, stride, &p1, &p0, &q0, &q1);
  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);
  Store16x4_SSE2(&p1, &p0, &q0, &q1, p, p + 8 * stride, stride);
}